

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O0

double filter_catmullrom(double x)

{
  double x_local;
  
  if (-2.0 <= x) {
    if (-1.0 <= x) {
      if (0.0 <= x) {
        if (1.0 <= x) {
          if (2.0 <= x) {
            x_local = 0.0;
          }
          else {
            x_local = (x * (x * (5.0 - x) + -8.0) + 4.0) * 0.5;
          }
        }
        else {
          x_local = (x * x * (x * 3.0 + -5.0) + 2.0) * 0.5;
        }
      }
      else {
        x_local = (x * x * (x * -3.0 + -5.0) + 2.0) * 0.5;
      }
    }
    else {
      x_local = (x * (x * (x + 5.0) + 8.0) + 4.0) * 0.5;
    }
  }
  else {
    x_local = 0.0;
  }
  return x_local;
}

Assistant:

static double filter_catmullrom(const double x)
{
	if (x < -2.0)
		return(0.0f);
	if (x < -1.0)
		return(0.5f*(4.0f+x*(8.0f+x*(5.0f+x))));
	if (x < 0.0)
		return(0.5f*(2.0f+x*x*(-5.0f-3.0f*x)));
	if (x < 1.0)
		return(0.5f*(2.0f+x*x*(-5.0f+3.0f*x)));
	if (x < 2.0)
		return(0.5f*(4.0f+x*(-8.0f+x*(5.0f-x))));
	return(0.0f);
}